

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void __thiscall UnitTests::Assert::Fail(Assert *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Test FAIL\'ed","");
  Fail(this,&local_38);
}

Assistant:

[[noreturn]] void Fail() const { Fail("Test FAIL'ed"); }